

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O3

int coda_mem_cursor_use_base_type_of_special_type(coda_cursor *cursor)

{
  coda_dynamic_type_struct *pcVar1;
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar1[1].backend == 2) {
    pcVar1 = (coda_dynamic_type_struct *)&pcVar1->definition[1].type_class;
  }
  else {
    if (pcVar1[1].backend != 3) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x107,"int coda_mem_cursor_use_base_type_of_special_type(coda_cursor *)");
    }
    pcVar1 = pcVar1 + 2;
  }
  cursor->stack[(long)cursor->n + -1].type = *(coda_dynamic_type_struct **)pcVar1;
  return 0;
}

Assistant:

int coda_mem_cursor_use_base_type_of_special_type(coda_cursor *cursor)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        cursor->stack[cursor->n - 1].type = ((coda_mem_special *)cursor->stack[cursor->n - 1].type)->base_type;
        return 0;
    }

    assert(type->tag == tag_mem_data);
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)((coda_type_special *)type->definition)->base_type;

    return 0;
}